

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self,EVP_PKEY *key)

{
  ptls_openssl_signature_scheme_t *ppVar1;
  code *local_40;
  EVP_PKEY *local_38;
  ptls_openssl_signature_scheme_t *local_30;
  undefined8 local_28;
  EVP_PKEY *local_20;
  EVP_PKEY *key_local;
  ptls_openssl_sign_certificate_t *self_local;
  
  local_20 = key;
  key_local = (EVP_PKEY *)self;
  memset(&local_40,0,0x20);
  local_40 = sign_certificate;
  (self->super).cb = sign_certificate;
  self->key = local_38;
  self->schemes = local_30;
  *(undefined8 *)&self->field_0x18 = local_28;
  ppVar1 = ptls_openssl_lookup_signature_schemes(local_20);
  *(ptls_openssl_signature_scheme_t **)(key_local + 0x10) = ppVar1;
  if (ppVar1 == (ptls_openssl_signature_scheme_t *)0x0) {
    self_local._4_4_ = 0x204;
  }
  else {
    EVP_PKEY_up_ref(local_20);
    *(EVP_PKEY **)(key_local + 8) = local_20;
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int ptls_openssl_init_sign_certificate(ptls_openssl_sign_certificate_t *self, EVP_PKEY *key)
{
    *self = (ptls_openssl_sign_certificate_t){.super = {sign_certificate}, .async = 0 /* libssl has it off by default too */};

    if ((self->schemes = ptls_openssl_lookup_signature_schemes(key)) == NULL)
        return PTLS_ERROR_INCOMPATIBLE_KEY;
    EVP_PKEY_up_ref(key);
    self->key = key;

    return 0;
}